

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::genSortFunction_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,size_t *rel_id)

{
  CppGenerator *this_00;
  size_t sVar1;
  Attribute *pAVar2;
  ulong uVar3;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  CppGenerator *local_1b8;
  string local_1b0;
  TDNode *local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string returnString;
  string relName;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string sortAlgo;
  
  local_190 = TreeDecomposition::getRelation
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         *rel_id);
  std::__cxx11::string::string((string *)&relName,(string *)local_190);
  std::__cxx11::string::string((string *)&sortAlgo,"std::sort(",(allocator *)&returnString);
  offset_abi_cxx11_(&local_1f8,this,1);
  std::operator+(&local_1d8,&local_1f8,"void sort");
  std::operator+(&local_218,&local_1d8,&relName);
  std::operator+(&local_238,&local_218,"()\n");
  offset_abi_cxx11_(&local_1b0,this,1);
  std::operator+(&bStack_258,&local_238,&local_1b0);
  std::operator+(&returnString,&bStack_258,"{\n");
  std::__cxx11::string::~string((string *)&bStack_258);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  if (multifaq::cppgen::BENCH_INDIVIDUAL == '\x01') {
    offset_abi_cxx11_(&local_218,this,2);
    std::operator+(&local_238,&local_218,"int64_t startProcess = duration_cast<milliseconds>(");
    std::operator+(&bStack_258,&local_238,"system_clock::now().time_since_epoch()).count();\n\n");
    std::__cxx11::string::append((string *)&returnString);
    std::__cxx11::string::~string((string *)&bStack_258);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_218);
  }
  offset_abi_cxx11_(&local_90,this,2);
  std::operator+(&local_70,&local_90,&sortAlgo);
  std::operator+(&local_168,&local_70,&relName);
  std::operator+(&local_148,&local_168,".begin(),");
  std::operator+(&local_128,&local_148,&relName);
  std::operator+(&local_188,&local_128,".end(),[ ](const ");
  std::operator+(&local_1b0,&local_188,&relName);
  std::operator+(&local_1f8,&local_1b0,"_tuple& lhs, const ");
  std::operator+(&local_1d8,&local_1f8,&relName);
  std::operator+(&local_218,&local_1d8,"_tuple& rhs)\n");
  offset_abi_cxx11_(&local_b0,this,2);
  std::operator+(&local_238,&local_218,&local_b0);
  std::operator+(&bStack_258,&local_238,"{\n");
  local_1b8 = this;
  std::__cxx11::string::append((string *)&returnString);
  std::__cxx11::string::~string((string *)&bStack_258);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  local_190 = (TDNode *)&local_190->_bag;
  uVar3 = 0;
  while( true ) {
    sVar1 = std::_Base_bitset<2UL>::_M_do_count((_Base_bitset<2UL> *)local_190);
    this_00 = local_1b8;
    if (sVar1 <= uVar3) break;
    pAVar2 = TreeDecomposition::getAttribute
                       ((local_1b8->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        local_1b8->sortOrders[*rel_id][uVar3]);
    offset_abi_cxx11_(&local_90,this_00,3);
    std::operator+(&local_70,&local_90,"if(lhs.");
    __rhs = &pAVar2->_name;
    std::operator+(&local_168,&local_70,__rhs);
    std::operator+(&local_148,&local_168," != rhs.");
    std::operator+(&local_128,&local_148,__rhs);
    std::operator+(&local_188,&local_128,")\n");
    offset_abi_cxx11_(&local_b0,local_1b8,4);
    std::operator+(&local_1b0,&local_188,&local_b0);
    std::operator+(&local_1f8,&local_1b0,"return lhs.");
    std::operator+(&local_1d8,&local_1f8,__rhs);
    std::operator+(&local_218,&local_1d8," < rhs.");
    std::operator+(&local_238,&local_218,__rhs);
    std::operator+(&bStack_258,&local_238,";\n");
    std::__cxx11::string::append((string *)&returnString);
    std::__cxx11::string::~string((string *)&bStack_258);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    uVar3 = uVar3 + 1;
  }
  offset_abi_cxx11_(&local_1d8,local_1b8,3);
  std::operator+(&local_218,&local_1d8,"return false;\n");
  offset_abi_cxx11_(&local_1f8,this_00,2);
  std::operator+(&local_238,&local_218,&local_1f8);
  std::operator+(&bStack_258,&local_238,"});\n");
  std::__cxx11::string::append((string *)&returnString);
  std::__cxx11::string::~string((string *)&bStack_258);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1d8);
  if (multifaq::cppgen::BENCH_INDIVIDUAL == '\x01') {
    offset_abi_cxx11_(&local_148,this_00,2);
    std::operator+(&local_128,"\n",&local_148);
    std::operator+(&local_188,&local_128,"int64_t endProcess = duration_cast<milliseconds>(");
    std::operator+(&local_1b0,&local_188,
                   "system_clock::now().time_since_epoch()).count()-startProcess;\n");
    offset_abi_cxx11_(&local_168,this_00,2);
    std::operator+(&local_1f8,&local_1b0,&local_168);
    std::operator+(&local_1d8,&local_1f8,"std::cout << \"Sort Relation ");
    std::operator+(&local_218,&local_1d8,&relName);
    std::operator+(&local_238,&local_218,": \"+");
    std::operator+(&bStack_258,&local_238,"std::to_string(endProcess)+\"ms.\\n\";\n\n");
    std::__cxx11::string::append((string *)&returnString);
    std::__cxx11::string::~string((string *)&bStack_258);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
  }
  offset_abi_cxx11_(&local_238,this_00,1);
  std::operator+(&bStack_258,&returnString,&local_238);
  std::operator+(__return_storage_ptr__,&bStack_258,"}\n");
  std::__cxx11::string::~string((string *)&bStack_258);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&returnString);
  std::__cxx11::string::~string((string *)&sortAlgo);
  std::__cxx11::string::~string((string *)&relName);
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::genSortFunction(const size_t& rel_id)
{
    TDNode* relation = _td->getRelation(rel_id);
    std::string relName = relation->_name;

#if defined(__GNUC__) && defined(NDEBUG) && !defined(__clang__)
    std::string sortAlgo = "__gnu_parallel::sort(";
#else
    std::string sortAlgo = "std::sort(";
#endif
    
    std::string returnString = offset(1)+"void sort"+relName+"()\n"+offset(1)+"{\n";

    if (BENCH_INDIVIDUAL)
        returnString += offset(2)+"int64_t startProcess = duration_cast<milliseconds>("+
            "system_clock::now().time_since_epoch()).count();\n\n";

    returnString += offset(2)+sortAlgo+relName+".begin(),"+
        relName+".end(),[ ](const "+relName+"_tuple& lhs, const "+relName+
        "_tuple& rhs)\n"+offset(2)+"{\n";

    // size_t orderIdx = 0;
    // for (const size_t& var : varOrder)
    // {
    //     if (baseRelation->_bag[var])
    //     {
    //         const std::string& attrName = _td->getAttribute(var)->_name;
    //         returnString += offset(3)+"if(lhs."+attrName+" != rhs."+attrName+")\n"+
    //             offset(4)+"return lhs."+attrName+" < rhs."+attrName+";\n";
    //         // Reset the relSortOrder array for future calls 
    //         sortOrders[view->_origin][orderIdx] = var;
    //         ++orderIdx;
    //     }
    // }

    for (size_t var = 0; var < relation->_bag.count(); ++var)
    {
        const std::string& attrName = _td->getAttribute(sortOrders[rel_id][var])->_name;
        returnString += offset(3)+"if(lhs."+attrName+" != rhs."+attrName+")\n"+
            offset(4)+"return lhs."+attrName+" < rhs."+attrName+";\n";
    }
    returnString += offset(3)+"return false;\n"+offset(2)+"});\n";

    if (BENCH_INDIVIDUAL)
        returnString += "\n"+offset(2)+
            "int64_t endProcess = duration_cast<milliseconds>("+
            "system_clock::now().time_since_epoch()).count()-startProcess;\n"+
            offset(2)+"std::cout << \"Sort Relation "+relName+": \"+"+
            "std::to_string(endProcess)+\"ms.\\n\";\n\n";    
        // offset(2)+"std::ofstream ofs(\"times.txt\",std::ofstream::out | " +
        // "std::ofstream::app);\n"+
        // offset(2)+"ofs << \"\\t\" << endProcess;\n"+
        // offset(2)+"ofs.close();\n";
    
    return returnString+offset(1)+"}\n";
}